

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmo.c
# Opt level: O0

int decode_packet(AVPacket *pkt)

{
  uint uVar1;
  long lVar2;
  FILE *pFVar3;
  char *pcVar4;
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  AVMotionVector *mv;
  AVMotionVector *mvs;
  AVFrameSideData *sd;
  char local_1b0 [4];
  int i;
  char local_170 [64];
  FILE *local_130;
  FILE *file;
  char szFileName [255];
  int local_1c;
  int ret;
  AVPacket *pkt_local;
  
  local_1c = avcodec_send_packet(video_dec_ctx);
  memset(&file,0,0xff);
  pFVar3 = _stderr;
  local_130 = (FILE *)0x0;
  if (local_1c < 0) {
    memset(local_170,0,0x40);
    pcVar4 = av_make_error_string(local_170,0x40,local_1c);
    fprintf(pFVar3,"Error while sending a packet to the decoder: %s\n",pcVar4);
    pkt_local._4_4_ = local_1c;
  }
  else {
    while (((-1 < local_1c &&
            (local_1c = avcodec_receive_frame(video_dec_ctx), pFVar3 = _stderr, local_1c != -0xb))
           && (local_1c != -0x20464f45))) {
      if (local_1c < 0) {
        memset(local_1b0,0,0x40);
        pcVar4 = av_make_error_string(local_1b0,0x40,local_1c);
        fprintf(pFVar3,"Error while receiving a frame from the decoder: %s\n",pcVar4);
        return local_1c;
      }
      if (-1 < local_1c) {
        video_frame_count = video_frame_count + 1;
        sprintf((char *)&file,"./output/mv/%d.json",(ulong)(uint)video_frame_count);
        local_130 = fopen((char *)&file,"w");
        if (local_130 == (FILE *)0x0) {
          fprintf(_stderr,"Couldn\'t open file for reading\n");
          exit(1);
        }
        fprintf(local_130,"[\n");
        lVar5 = av_frame_get_side_data(frame,8);
        if (lVar5 != 0) {
          lVar2 = *(long *)(lVar5 + 8);
          for (sd._4_4_ = 0; (ulong)(long)sd._4_4_ < (ulong)(long)*(int *)(lVar5 + 0x10) / 0x28;
              sd._4_4_ = sd._4_4_ + 1) {
            puVar6 = (uint *)(lVar2 + (long)sd._4_4_ * 0x28);
            uVar7 = (ulong)(long)*(int *)(lVar5 + 0x10) % 0x28;
            if ((long)sd._4_4_ == (ulong)(long)*(int *)(lVar5 + 0x10) / 0x28 - 1) {
              fprintf(local_130,"\t{\n",uVar7);
              fprintf(local_130,"\t\t\"source\" : %d,\n",(ulong)*puVar6);
              fprintf(local_130,"\t\t\"width\" : %d,\n",(ulong)(byte)puVar6[1]);
              fprintf(local_130,"\t\t\"height\" : %d,\n",(ulong)*(byte *)((long)puVar6 + 5));
              if ((int)*puVar6 < 0) {
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 6) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_y\" : %d,\n",
                        (long)(int)(short)puVar6[2] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 10) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_y\" : %d,\n",
                        (long)(int)(short)puVar6[3] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dx\" : %d,\n",
                        (long)((int)*(short *)((long)puVar6 + 10) -
                              (int)*(short *)((long)puVar6 + 6)) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dy\" : %d\n",
                        (long)((int)(short)puVar6[3] - (int)(short)puVar6[2]) / (long)(int)uVar1 &
                        0xffffffff);
              }
              else {
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 10) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_y\" : %d,\n",
                        (long)(int)(short)puVar6[3] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 6) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_y\" : %d,\n",
                        (long)(int)(short)puVar6[2] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dx\" : %d,\n",
                        (long)((int)*(short *)((long)puVar6 + 6) -
                              (int)*(short *)((long)puVar6 + 10)) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dy\" : %d\n",
                        (long)((int)(short)puVar6[2] - (int)(short)puVar6[3]) / (long)(int)uVar1 &
                        0xffffffff);
              }
              fprintf(local_130,"\t}\n");
            }
            else {
              fprintf(local_130,"\t{\n",uVar7);
              fprintf(local_130,"\t\t\"source\" : %d,\n",(ulong)*puVar6);
              fprintf(local_130,"\t\t\"width\" : %d,\n",(ulong)(byte)puVar6[1]);
              fprintf(local_130,"\t\t\"height\" : %d,\n",(ulong)*(byte *)((long)puVar6 + 5));
              if ((int)*puVar6 < 0) {
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 6) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_y\" : %d,\n",
                        (long)(int)(short)puVar6[2] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 10) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_y\" : %d,\n",
                        (long)(int)(short)puVar6[3] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dx\" : %d,\n",
                        (long)((int)*(short *)((long)puVar6 + 10) -
                              (int)*(short *)((long)puVar6 + 6)) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dy\" : %d\n",
                        (long)((int)(short)puVar6[3] - (int)(short)puVar6[2]) / (long)(int)uVar1 &
                        0xffffffff);
              }
              else {
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 10) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"src_y\" : %d,\n",
                        (long)(int)(short)puVar6[3] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_x\" : %d,\n",
                        (long)(int)*(short *)((long)puVar6 + 6) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dst_y\" : %d,\n",
                        (long)(int)(short)puVar6[2] / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dx\" : %d,\n",
                        (long)((int)*(short *)((long)puVar6 + 6) -
                              (int)*(short *)((long)puVar6 + 10)) / (long)(int)uVar1 & 0xffffffff);
                uVar1 = *puVar6;
                if ((int)uVar1 < 1) {
                  uVar1 = -uVar1;
                }
                fprintf(local_130,"\t\t\"dy\" : %d\n",
                        (long)((int)(short)puVar6[2] - (int)(short)puVar6[3]) / (long)(int)uVar1 &
                        0xffffffff);
              }
              fprintf(local_130,"\t},\n");
            }
          }
        }
        fprintf(local_130,"]\n");
        fclose(local_130);
        printf("\rTotal Processed Frames:%d",(ulong)(uint)video_frame_count);
        fflush(_stdout);
        av_frame_unref(frame);
      }
    }
    pkt_local._4_4_ = 0;
  }
  return pkt_local._4_4_;
}

Assistant:

static int decode_packet(const AVPacket *pkt)
{
    int ret = avcodec_send_packet(video_dec_ctx, pkt);
    char szFileName[255] = {0};
    FILE *file=NULL;
    if (ret < 0) {
        fprintf(stderr, "Error while sending a packet to the decoder: %s\n", av_err2str(ret));
        return ret;
    }

    while (ret >= 0)  {
        ret = avcodec_receive_frame(video_dec_ctx, frame);
        if (ret == AVERROR(EAGAIN) || ret == AVERROR_EOF) {
            break;
        } else if (ret < 0) {
            fprintf(stderr, "Error while receiving a frame from the decoder: %s\n", av_err2str(ret));
            return ret;
        }

        if (ret >= 0) {
            int i;
            AVFrameSideData *sd;
	    video_frame_count++;
            sprintf(szFileName, "./output/mv/%d.json", video_frame_count);
            file = fopen(szFileName,"w");
            if (file == NULL)
            {
                fprintf(stderr, "Couldn't open file for reading\n");
                exit(1);
            }
            fprintf(file, "[\n");
            sd = av_frame_get_side_data(frame, AV_FRAME_DATA_MOTION_VECTORS);
            if (sd) {
                const AVMotionVector *mvs = (const AVMotionVector *)sd->data;
                for (i = 0; i < sd->size / sizeof(*mvs); i++) {
                    const AVMotionVector *mv = &mvs[i];
                    // print_motion_vectors_data(mv, video_frame_count);
                    if(i==(sd->size / sizeof(*mvs))-1){
                      fprintf(file, "\t{\n");
                      fprintf(file, "\t\t\"source\" : %d,\n", mv->source);
                      fprintf(file, "\t\t\"width\" : %d,\n", mv->w);
                      fprintf(file, "\t\t\"height\" : %d,\n", mv->h);
                      if(mv->source<0){
                        fprintf(file, "\t\t\"src_x\" : %d,\n", ((mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->src_y)/abs(mv->source));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->dst_x - mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->dst_y - mv->src_y)/abs(mv->source)));
                      }else{
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->src_x - mv->dst_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->src_y - mv->dst_y)/abs(mv->source)));
                      }
                      fprintf(file, "\t}\n");
                    }else{
                      fprintf(file, "\t{\n");
                      fprintf(file, "\t\t\"source\" : %d,\n", mv->source);
                      fprintf(file, "\t\t\"width\" : %d,\n", mv->w);
                      fprintf(file, "\t\t\"height\" : %d,\n", mv->h);
                      if(mv->source<0){
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->dst_x - mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->dst_y - mv->src_y)/abs(mv->source)));
                      }else{
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->src_x - mv->dst_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->src_y - mv->dst_y)/abs(mv->source)));
                      }
                      fprintf(file, "\t},\n");
                    }
                }
                // printf("%s\n", strcat( "./output/", strcat(video_frame_count, ".json")));
            }
            fprintf(file, "]\n");
            fclose(file);
	    printf("\rTotal Processed Frames:%d", video_frame_count);
	    fflush(stdout);
            //Print frame data
            // print_frame_data(frame);
            av_frame_unref(frame);
        }
    }
    return 0;
}